

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void Catch::anon_unknown_1::hexEscapeChar(ostream *os,uchar c)

{
  undefined4 uVar1;
  long lVar2;
  ostream *poVar3;
  undefined7 in_register_00000031;
  
  uVar1 = *(undefined4 *)(os + *(long *)(*(long *)os + -0x18) + 0x18);
  poVar3 = std::operator<<((ostream *)os,"\\x");
  lVar2 = *(long *)poVar3;
  *(uint *)(poVar3 + *(long *)(lVar2 + -0x18) + 0x18) =
       *(uint *)(poVar3 + *(long *)(lVar2 + -0x18) + 0x18) | 0x4000;
  lVar2 = *(long *)(lVar2 + -0x18);
  *(uint *)(poVar3 + lVar2 + 0x18) = *(uint *)(poVar3 + lVar2 + 0x18) & 0xffffffb5 | 8;
  poVar3 = std::operator<<(poVar3,0x30);
  *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 2;
  std::ostream::operator<<(poVar3,(int)CONCAT71(in_register_00000031,c));
  *(undefined4 *)(os + *(long *)(*(long *)os + -0x18) + 0x18) = uVar1;
  return;
}

Assistant:

void hexEscapeChar(std::ostream& os, unsigned char c) {
        std::ios_base::fmtflags f(os.flags());
        os << "\\x"
            << std::uppercase << std::hex << std::setfill('0') << std::setw(2)
            << static_cast<int>(c);
        os.flags(f);
    }